

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filter_encoder.c
# Opt level: O2

uint64_t lzma_mt_block_size(lzma_filter *filters)

{
  lzma_filter_encoder *plVar1;
  uint64_t uVar2;
  ulong uVar3;
  void **ppvVar4;
  
  ppvVar4 = &filters->options;
  uVar3 = 0;
  do {
    if (((lzma_filter *)(ppvVar4 + -1))->id == 0xffffffffffffffff) {
      return uVar3;
    }
    plVar1 = encoder_find(((lzma_filter *)(ppvVar4 + -1))->id);
    if (plVar1->block_size != (_func_uint64_t_void_ptr *)0x0) {
      uVar2 = (*plVar1->block_size)(*ppvVar4);
      if (uVar3 < uVar2) {
        uVar3 = uVar2;
      }
      if (uVar2 == 0) {
        return 0;
      }
    }
    ppvVar4 = ppvVar4 + 2;
  } while( true );
}

Assistant:

extern uint64_t
lzma_mt_block_size(const lzma_filter *filters)
{
	uint64_t max = 0;

	for (size_t i = 0; filters[i].id != LZMA_VLI_UNKNOWN; ++i) {
		const lzma_filter_encoder *const fe
				= encoder_find(filters[i].id);
		if (fe->block_size != NULL) {
			const uint64_t size
					= fe->block_size(filters[i].options);
			if (size == 0)
				return 0;

			if (size > max)
				max = size;
		}
	}

	return max;
}